

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.cpp
# Opt level: O2

bool stackjit::TypeSystem::getClassAndFieldName(string *str,string *className,string *fieldName)

{
  long lVar1;
  string asStack_48 [32];
  
  lVar1 = std::__cxx11::string::find((char *)str,0x17c161);
  if (lVar1 != -1) {
    std::__cxx11::string::substr((ulong)asStack_48,(ulong)str);
    std::__cxx11::string::operator=((string *)className,asStack_48);
    std::__cxx11::string::~string(asStack_48);
    std::__cxx11::string::substr((ulong)asStack_48,(ulong)str);
    std::__cxx11::string::operator=((string *)fieldName,asStack_48);
    std::__cxx11::string::~string(asStack_48);
  }
  return lVar1 != -1;
}

Assistant:

bool TypeSystem::getClassAndFieldName(std::string str,  std::string& className, std::string& fieldName) {
	    auto fieldSepPos = str.find("::");

	    if (fieldSepPos != std::string::npos) {
	        className = str.substr(0, fieldSepPos);
	        fieldName = str.substr(fieldSepPos + 2);
	        return true;
	    } else {
	    	return false;
	    }
	}